

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O0

void checkfile(char *inp,permonst *pm,boolean user_typed_name,boolean without_asking)

{
  bool bVar1;
  bool bVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  dlb *dp;
  char *pcVar8;
  char *title;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  int i;
  int entry_count;
  long entry_offset;
  char *alt;
  menulist menu;
  char mnname [256];
  int mntmp;
  boolean skipping_entry;
  boolean found_in_file;
  long lStack_240;
  int chk_skip;
  long txt_offset;
  char *dbase_str;
  char *ep;
  char newstr [256];
  char buf [256];
  dlb *fp;
  boolean without_asking_local;
  boolean user_typed_name_local;
  permonst *pm_local;
  char *inp_local;
  
  bVar2 = false;
  bVar1 = false;
  dp = dlb_fopen("data","r");
  if (dp == (dlb *)0x0) {
    pline("Cannot open data file!");
    return;
  }
  if (user_typed_name != '\0') {
    pline("Looking up \"%s\"...",inp);
  }
  if ((pm == (permonst *)0x0) || (user_typed_name != '\0')) {
    txt_offset = (long)strcpy((char *)&ep,inp);
  }
  else {
    pcVar8 = mons_mname(pm);
    txt_offset = (long)strcpy((char *)&ep,pcVar8);
  }
  lcase((char *)txt_offset);
  iVar5 = strncmp((char *)txt_offset,"interior of ",0xc);
  if (iVar5 == 0) {
    txt_offset = txt_offset + 0xc;
  }
  iVar5 = strncmp((char *)txt_offset,"a ",2);
  if (iVar5 == 0) {
    txt_offset = txt_offset + 2;
  }
  else {
    iVar5 = strncmp((char *)txt_offset,"an ",3);
    if (iVar5 == 0) {
      txt_offset = txt_offset + 3;
    }
    else {
      iVar5 = strncmp((char *)txt_offset,"the ",4);
      if (iVar5 == 0) {
        txt_offset = txt_offset + 4;
      }
    }
  }
  iVar5 = strncmp((char *)txt_offset,"tame ",5);
  if (iVar5 == 0) {
    txt_offset = txt_offset + 5;
  }
  else {
    iVar5 = strncmp((char *)txt_offset,"peaceful ",9);
    if (iVar5 == 0) {
      txt_offset = txt_offset + 9;
    }
  }
  iVar5 = strncmp((char *)txt_offset,"invisible ",10);
  if (iVar5 == 0) {
    txt_offset = txt_offset + 10;
  }
  iVar5 = strncmp((char *)txt_offset,"statue of ",10);
  if (iVar5 == 0) {
    *(undefined1 *)(txt_offset + 6) = 0;
  }
  else {
    iVar5 = strncmp((char *)txt_offset,"figurine of ",0xc);
    if (iVar5 == 0) {
      *(undefined1 *)(txt_offset + 8) = 0;
    }
  }
  if (*(char *)txt_offset == '\0') {
LAB_00282f78:
    init_menulist((menulist *)&alt);
    iVar5 = name_to_mon((char *)txt_offset);
    if (-1 < iVar5) {
      pcVar8 = mons_mname(mons + iVar5);
      strcpy((char *)&menu.size,pcVar8);
      lcase((char *)&menu.size);
      iVar7 = strcmp((char *)txt_offset,(char *)&menu.size);
      if (iVar7 == 0) {
        pcVar8 = mons_mname(mons + iVar5);
        txt_offset = (long)strcpy((char *)&ep,pcVar8);
        mondesc_all((menulist *)&alt,mons + iVar5);
      }
    }
    if (bVar2) {
      do {
        pcVar8 = dlb_fgets(newstr + 0xf8,0x100,dp);
        if (pcVar8 == (char *)0x0) goto LAB_002830ce;
        bVar3 = digit(newstr[0xf8]);
      } while (bVar3 == '\0');
      iVar5 = __isoc99_sscanf(newstr + 0xf8,"%ld,%d\n",&i);
      if (iVar5 < 2) goto LAB_002830ce;
      if (((user_typed_name != '\0') || (without_asking != '\0')) ||
         (cVar4 = yn_function("More info?","yn",'n'), cVar4 == 'y')) {
        iVar5 = dlb_fseek(dp,lStack_240 + _i,0);
        if (iVar5 < 0) {
          pline("? Seek error on \'data\' file!");
          free(alt);
          dlb_fclose(dp);
          return;
        }
        if (menu.items._4_4_ != 0) {
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            alt = (char *)realloc(alt,(long)(int)menu.items * 0x10c);
          }
          pcVar8 = alt + (long)menu.items._4_4_ * 0x10c;
          pcVar8[0] = '\0';
          pcVar8[1] = '\0';
          pcVar8[2] = '\0';
          pcVar8[3] = '\0';
          pcVar8[4] = '\0';
          pcVar8[5] = '\0';
          pcVar8[6] = '\0';
          pcVar8[7] = '\0';
          pcVar8[0x108] = '\0';
          pcVar8[0x109] = '\0';
          pcVar8[0x10a] = '\0';
          strcpy(pcVar8 + 8,"");
          menu.items._4_4_ = menu.items._4_4_ + 1;
        }
        for (_item_._0_4_ = 0; (int)_item_ < _item_._4_4_; _item_._0_4_ = (int)_item_ + 1) {
          pcVar8 = dlb_fgets(newstr + 0xf8,0x100,dp);
          if (pcVar8 == (char *)0x0) goto LAB_002830ce;
          dbase_str = strchr(newstr + 0xf8,10);
          if (dbase_str != (char *)0x0) {
            *dbase_str = '\0';
          }
          pcVar8 = strchr(newstr + 0xf9,9);
          if (pcVar8 != (char *)0x0) {
            tabexpand(newstr + 0xf9);
          }
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            alt = (char *)realloc(alt,(long)(int)menu.items * 0x10c);
          }
          pcVar8 = alt + (long)menu.items._4_4_ * 0x10c;
          pcVar8[0] = '\0';
          pcVar8[1] = '\0';
          pcVar8[2] = '\0';
          pcVar8[3] = '\0';
          pcVar8[4] = '\0';
          pcVar8[5] = '\0';
          pcVar8[6] = '\0';
          pcVar8[7] = '\0';
          pcVar8[0x108] = '\0';
          pcVar8[0x109] = '\0';
          pcVar8[0x10a] = '\0';
          strcpy(pcVar8 + 8,newstr + 0xf9);
          menu.items._4_4_ = menu.items._4_4_ + 1;
        }
      }
    }
    else if ((user_typed_name != '\0') && (menu.items._4_4_ == 0)) {
      pline("I don\'t have any information on those things.");
    }
    iVar5 = menu.items._4_4_;
    pcVar8 = alt;
    if (menu.items._4_4_ != 0) {
      title = upstart((char *)txt_offset);
      display_menu((nh_menuitem *)pcVar8,iVar5,title,0,(int *)0x0);
    }
    free(alt);
    dlb_fclose(dp);
  }
  else {
    entry_offset = 0;
    dbase_str = strstri((char *)txt_offset," [seen");
    if ((dbase_str != (char *)0x0) ||
       (dbase_str = strstri((char *)txt_offset," and more"), dbase_str != (char *)0x0)) {
      *dbase_str = '\0';
    }
    dbase_str = strstri((char *)txt_offset," named ");
    if (dbase_str == (char *)0x0) {
      dbase_str = strstri((char *)txt_offset," called ");
    }
    else {
      entry_offset = (long)(dbase_str + 7);
    }
    if (dbase_str == (char *)0x0) {
      dbase_str = strstri((char *)txt_offset,", ");
    }
    if ((dbase_str != (char *)0x0) && ((ulong)txt_offset < dbase_str)) {
      *dbase_str = '\0';
    }
    if (entry_offset == 0) {
      entry_offset = (long)makesingular((char *)txt_offset);
    }
    else if (user_typed_name != '\0') {
      lcase((char *)entry_offset);
    }
    lStack_240 = 0;
    pcVar8 = dlb_fgets(newstr + 0xf8,0x100,dp);
    if ((pcVar8 == (char *)0x0) ||
       (pcVar8 = dlb_fgets(newstr + 0xf8,0x100,dp), pcVar8 == (char *)0x0)) {
      impossible("can\'t read \'data\' file");
      dlb_fclose(dp);
      return;
    }
    iVar5 = __isoc99_sscanf(newstr + 0xf8,"%8lx\n",&stack0xfffffffffffffdc0);
    if ((0 < iVar5) && (0 < lStack_240)) {
      while( true ) {
        do {
          do {
            while( true ) {
              pcVar8 = dlb_fgets(newstr + 0xf8,0x100,dp);
              if ((pcVar8 == (char *)0x0) || (newstr[0xf8] == '.')) goto LAB_00282f78;
              bVar3 = digit(newstr[0xf8]);
              if (bVar3 == '\0') break;
              bVar1 = false;
            }
          } while (bVar1);
          dbase_str = strchr(newstr + 0xf8,10);
          if (dbase_str == (char *)0x0) goto LAB_002830ce;
          *dbase_str = '\0';
          uVar6 = (uint)(newstr[0xf8] == '~');
          bVar3 = pmatch(newstr + (long)(int)uVar6 + 0xf8,(char *)txt_offset);
        } while ((bVar3 == '\0') &&
                ((entry_offset == 0 ||
                 (bVar3 = pmatch(newstr + (long)(int)uVar6 + 0xf8,(char *)entry_offset),
                 bVar3 == '\0'))));
        if (uVar6 == 0) break;
        bVar1 = true;
      }
      bVar2 = true;
      goto LAB_00282f78;
    }
LAB_002830ce:
    impossible("\'data\' file in wrong format");
    free(alt);
    dlb_fclose(dp);
  }
  return;
}

Assistant:

static void checkfile(const char *inp, struct permonst *pm, boolean user_typed_name,
		      boolean without_asking)
{
    dlb *fp;
    char buf[BUFSZ], newstr[BUFSZ];
    char *ep, *dbase_str;
    long txt_offset;
    int chk_skip;
    boolean found_in_file = FALSE, skipping_entry = FALSE;
    int mntmp;
    char mnname[BUFSZ];
    struct menulist menu;

    fp = dlb_fopen(DATAFILE, "r");
    if (!fp) {
	pline("Cannot open data file!");
	return;
    }

    if (user_typed_name)
	pline("Looking up \"%s\"...", inp);

    /* To prevent the need for entries in data.base like *ngel to account
     * for Angel and angel, make the lookup string the same for both
     * user_typed_name and picked name.
     */
    if (pm != NULL && !user_typed_name)
	dbase_str = strcpy(newstr, mons_mname(pm));
    else dbase_str = strcpy(newstr, inp);
    lcase(dbase_str);

    if (!strncmp(dbase_str, "interior of ", 12))
	dbase_str += 12;
    if (!strncmp(dbase_str, "a ", 2))
	dbase_str += 2;
    else if (!strncmp(dbase_str, "an ", 3))
	dbase_str += 3;
    else if (!strncmp(dbase_str, "the ", 4))
	dbase_str += 4;
    if (!strncmp(dbase_str, "tame ", 5))
	dbase_str += 5;
    else if (!strncmp(dbase_str, "peaceful ", 9))
	dbase_str += 9;
    if (!strncmp(dbase_str, "invisible ", 10))
	dbase_str += 10;
    if (!strncmp(dbase_str, "statue of ", 10))
	dbase_str[6] = '\0';
    else if (!strncmp(dbase_str, "figurine of ", 12))
	dbase_str[8] = '\0';

    /* Make sure the name is non-empty. */
    if (*dbase_str) {
	/* adjust the input to remove " [seen" and "named " and convert to lower case */
	char *alt = 0;	/* alternate description */

	if ((ep = strstri(dbase_str, " [seen")) != 0 ||
	    (ep = strstri(dbase_str, " and more")) != 0)
	    *ep = '\0';

	if ((ep = strstri(dbase_str, " named ")) != 0)
	    alt = ep + 7;
	else
	    ep = strstri(dbase_str, " called ");
	if (!ep) ep = strstri(dbase_str, ", ");
	if (ep && ep > dbase_str) *ep = '\0';

	/*
	 * If the object is named, then the name is the alternate description;
	 * otherwise, the result of makesingular() applied to the name is. This
	 * isn't strictly optimal, but named objects of interest to the user
	 * will usually be found under their name, rather than under their
	 * object type, so looking for a singular form is pointless.
	 */

	if (!alt)
	    alt = makesingular(dbase_str);
	else
	    if (user_typed_name)
		lcase(alt);

	/* skip first record; read second */
	txt_offset = 0L;
	if (!dlb_fgets(buf, BUFSZ, fp) || !dlb_fgets(buf, BUFSZ, fp)) {
	    impossible("can't read 'data' file");
	    dlb_fclose(fp);
	    return;
	} else if (sscanf(buf, "%8lx\n", &txt_offset) < 1 || txt_offset <= 0)
	    goto bad_data_file;

	/* look for the appropriate entry */
	while (dlb_fgets(buf,BUFSZ,fp)) {
	    if (*buf == '.') break;  /* we passed last entry without success */

	    if (digit(*buf)) {
		/* a number indicates the end of current entry */
		skipping_entry = FALSE;
	    } else if (!skipping_entry) {
		if (!(ep = strchr(buf, '\n'))) goto bad_data_file;
		*ep = 0;
		/* if we match a key that begins with "~", skip this entry */
		chk_skip = (*buf == '~') ? 1 : 0;
		if (pmatch(&buf[chk_skip], dbase_str) ||
			(alt && pmatch(&buf[chk_skip], alt))) {
		    if (chk_skip) {
			skipping_entry = TRUE;
			continue;
		    } else {
			found_in_file = TRUE;
			break;
		    }
		}
	    }
	}
    }

    init_menulist(&menu);

    mntmp = name_to_mon(dbase_str);
    if (mntmp >= LOW_PM) {
	strcpy(mnname, mons_mname(&mons[mntmp]));
	lcase(mnname);
	if (!strcmp(dbase_str, mnname)) {
	    dbase_str = strcpy(newstr, mons_mname(&mons[mntmp]));
	    mondesc_all(&menu, &mons[mntmp]);
	}
    }

    if (found_in_file) {
	long entry_offset;
	int  entry_count;
	int  i;

	/* skip over other possible matches for the info */
	do {
	    if (!dlb_fgets(buf, BUFSZ, fp))
		goto bad_data_file;
	} while (!digit(*buf));
	
	if (sscanf(buf, "%ld,%d\n", &entry_offset, &entry_count) < 2) {
bad_data_file:	impossible("'data' file in wrong format");
		free(menu.items);
		dlb_fclose(fp);
		return;
	}

	if (user_typed_name || without_asking || yn("More info?") == 'y') {

	    if (dlb_fseek(fp, txt_offset + entry_offset, SEEK_SET) < 0) {
		pline("? Seek error on 'data' file!");
		free(menu.items);
		dlb_fclose(fp);
		return;
	    }

	    if (menu.icount)
		add_menutext(&menu, "");

	    for (i = 0; i < entry_count; i++) {
		if (!dlb_fgets(buf, BUFSZ, fp))
		    goto bad_data_file;
		if ((ep = strchr(buf, '\n')) != 0)
		    *ep = 0;
		if (strchr(buf+1, '\t') != 0)
		    tabexpand(buf+1);
		add_menutext(&menu, buf+1);
	    }
	}
    } else if (user_typed_name && !menu.icount) {
	pline("I don't have any information on those things.");
    }

    if (menu.icount)
	display_menu(menu.items, menu.icount, upstart(dbase_str), FALSE, NULL);
    free(menu.items);

    dlb_fclose(fp);
}